

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propd.c
# Opt level: O1

void property_init(void)

{
  char *pcVar1;
  char *__s;
  char *pcVar2;
  char *value;
  ushort **ppuVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  uint sz;
  uint local_2c;
  
  lVar4 = 8;
  do {
    property_set(*(char **)((long)&mount_flags[8].flag + lVar4),
                 *(char **)((long)&set_default_properties_propList + lVar4));
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x38);
  __s = (char *)read_file("/platform//property/default.prop",&local_2c);
  if (__s != (char *)0x0) {
    pcVar2 = strchr(__s,10);
    pcVar6 = __s;
    while (pcVar2 != (char *)0x0) {
      *pcVar2 = '\0';
      value = strchr(pcVar6,0x3d);
      if (value != (char *)0x0) {
        *value = '\0';
        ppuVar3 = __ctype_b_loc();
        pcVar6 = pcVar6 + -1;
        do {
          pcVar1 = pcVar6 + 1;
          pcVar6 = pcVar6 + 1;
        } while ((*(byte *)((long)*ppuVar3 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
        pcVar5 = value;
        if (*pcVar1 != '#') {
          while ((pcVar5 = pcVar5 + -1, pcVar6 < pcVar5 &&
                 ((*(byte *)((long)*ppuVar3 + (long)*pcVar5 * 2 + 1) & 0x20) != 0))) {
            *pcVar5 = '\0';
          }
          do {
            pcVar1 = value + 1;
            value = value + 1;
            pcVar5 = pcVar2;
          } while ((*(byte *)((long)*ppuVar3 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
          while ((pcVar5 = pcVar5 + -1, value < pcVar5 &&
                 ((*(byte *)((long)*ppuVar3 + (long)*pcVar5 * 2 + 1) & 0x20) != 0))) {
            *pcVar5 = '\0';
          }
          property_set(pcVar6,value);
        }
      }
      pcVar6 = pcVar2 + 1;
      pcVar2 = strchr(pcVar6,10);
    }
    free(__s);
  }
  return;
}

Assistant:

void property_init(void)
{
    set_default_properties();
	load_properties_from_file(PROP_PATH_SYSTEM_DEFAULT);
}